

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_surface.cxx
# Opt level: O0

void __thiscall xray_re::xr_surface::save(xr_surface *this,xr_writer *w)

{
  xr_writer *w_local;
  xr_surface *this_local;
  
  xr_writer::w_sz(w,&this->m_name);
  xr_writer::w_sz(w,&this->m_eshader);
  xr_writer::w_sz(w,&this->m_cshader);
  xr_writer::w_sz(w,&this->m_gamemtl);
  xr_writer::w_sz(w,&this->m_texture);
  xr_writer::w_sz(w,&this->m_vmap);
  xr_writer::w_u32(w,this->m_flags);
  xr_writer::w_u32(w,this->m_fvf);
  xr_writer::w_u32(w,1);
  return;
}

Assistant:

void xr_surface::save(xr_writer& w) const
{
	w.w_sz(m_name);
	w.w_sz(m_eshader);
	w.w_sz(m_cshader);
	w.w_sz(m_gamemtl);
	w.w_sz(m_texture);
	w.w_sz(m_vmap);
	w.w_u32(m_flags);
	w.w_u32(m_fvf);
	w.w_u32(1);
}